

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::Instr::SetBailOutKind_NoAssert(Instr *this,BailOutKind bailOutKind)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = IsValidBailOutKindAndBits(bailOutKind);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4a3,"(IsValidBailOutKindAndBits(bailOutKind))",
                       "IsValidBailOutKindAndBits(bailOutKind)");
    if (!bVar3) goto LAB_004b4dcb;
    *puVar4 = 0;
  }
  IVar1 = this->m_kind;
  if (IVar1 == InstrKindProfiled) {
    *(BailOutKind *)&this[1].m_next = bailOutKind;
  }
  else if (IVar1 == InstrKindBranch) {
    *(BailOutKind *)&this[1].globOptInstrString = bailOutKind;
  }
  else if (IVar1 == InstrKindInstr) {
    *(BailOutKind *)&this[1].m_noLazyHelperAssert = bailOutKind;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4b0,"(false)","false");
    if (!bVar3) {
LAB_004b4dcb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void Instr::SetBailOutKind_NoAssert(const IR::BailOutKind bailOutKind)
{
    Assert(IsValidBailOutKindAndBits(bailOutKind));
    switch (this->m_kind)
    {
    case InstrKindInstr:
        ((BailOutInstr *)this)->bailOutKind = bailOutKind;
        break;
    case InstrKindProfiled:
        ((ProfiledBailOutInstr *)this)->bailOutKind = bailOutKind;
        break;
    case InstrKindBranch:
        ((BranchBailOutInstr *)this)->bailOutKind = bailOutKind;
        break;
    default:
        Assert(false);
        __assume(false);
    }
}